

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>const&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup> *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  uint uVar3;
  ushort uVar4;
  group_type_pointer pgVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup> *local_50;
  
  pgVar5 = __return_storage_ptr__->pg;
  uVar6 = (ulong)__return_storage_ptr__->n;
  local_50 = __return_storage_ptr__->p;
  lVar7 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar8[0] = -(pgVar2->m[0].n == '\0');
    auVar8[1] = -(pgVar2->m[1].n == '\0');
    auVar8[2] = -(pgVar2->m[2].n == '\0');
    auVar8[3] = -(pgVar2->m[3].n == '\0');
    auVar8[4] = -(pgVar2->m[4].n == '\0');
    auVar8[5] = -(pgVar2->m[5].n == '\0');
    auVar8[6] = -(pgVar2->m[6].n == '\0');
    auVar8[7] = -(pgVar2->m[7].n == '\0');
    auVar8[8] = -(pgVar2->m[8].n == '\0');
    auVar8[9] = -(pgVar2->m[9].n == '\0');
    auVar8[10] = -(pgVar2->m[10].n == '\0');
    auVar8[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar8[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar8[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar8[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar8[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar4 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe;
    if (uVar4 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar6 = (ulong)uVar3;
      local_50 = arrays_->elements_ + pos0 * 0xf + uVar6;
      std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>::pair
                (local_50,args);
      pgVar1->m[uVar6].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar5 = pgVar1;
    }
    if (uVar4 != 0) break;
    pos0 = pos0 + lVar7 & arrays_->groups_size_mask;
    lVar7 = lVar7 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar6;
  __return_storage_ptr__->p = local_50;
  __return_storage_ptr__->pg = pgVar5;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }